

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O2

int mbedtls_asn1_write_len_and_tag(uchar **p,uchar *start,size_t len,uchar tag)

{
  uchar *puVar1;
  int iVar2;
  
  iVar2 = mbedtls_asn1_write_len(p,start,len);
  if (-1 < iVar2) {
    puVar1 = *p;
    if (puVar1 == start || (long)puVar1 - (long)start < 0) {
      iVar2 = -0x6c;
    }
    else {
      *p = puVar1 + -1;
      puVar1[-1] = tag;
      iVar2 = iVar2 + (int)len + 1;
    }
  }
  return iVar2;
}

Assistant:

static int mbedtls_asn1_write_len_and_tag(unsigned char **p,
                                          const unsigned char *start,
                                          size_t len,
                                          unsigned char tag)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_len(p, start, len));
    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_tag(p, start, tag));

    return (int) len;
}